

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall ImFontAtlas::AddFontDefault(ImFontAtlas *this,ImFontConfig *font_cfg_template)

{
  ImFont *pIVar1;
  void *in_RSI;
  ImFontAtlas *in_RDI;
  ImFontAtlas *unaff_retaddr;
  ImFont *font;
  ImWchar *glyph_ranges;
  ImFontConfig font_cfg;
  undefined1 local_98 [20];
  float local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined1 local_78;
  float local_68;
  long local_60;
  undefined2 local_44;
  char local_42 [34];
  ImWchar *in_stack_ffffffffffffffe0;
  ImFontConfig *in_stack_ffffffffffffffe8;
  ImFontAtlas *pIVar2;
  
  pIVar2 = in_RDI;
  if (in_RSI == (void *)0x0) {
    ImFontConfig::ImFontConfig((ImFontConfig *)in_RDI);
  }
  else {
    memcpy(local_98,in_RSI,0x88);
  }
  if (in_RSI == (void *)0x0) {
    local_7c = 1;
    local_80 = 1;
    local_78 = 1;
  }
  if (local_84 <= 0.0) {
    local_84 = 20.0;
  }
  if (local_42[0] == '\0') {
    ImFormatString(local_42,0x28,"Roboto-Medium.ttf, %dpx",(ulong)(uint)(int)local_84);
  }
  local_44 = 0x85;
  local_68 = (float)(int)(local_84 / 13.0) * 1.0;
  if (local_60 == 0) {
    GetGlyphRangesDefault(in_RDI);
  }
  pIVar1 = AddFontFromMemoryCompressedTTF
                     (unaff_retaddr,pIVar2,(int)((ulong)in_RSI >> 0x20),SUB84(in_RSI,0),
                      in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontDefault(const ImFontConfig* font_cfg_template)
{
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (!font_cfg_template)
    {
        font_cfg.OversampleH = font_cfg.OversampleV = 1;
        font_cfg.PixelSnapH = true;
    }
    if (font_cfg.SizePixels <= 0.0f)
        font_cfg.SizePixels = 20.0f * 1.0f;
    if (font_cfg.Name[0] == '\0')
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "Roboto-Medium.ttf, %dpx", (int)font_cfg.SizePixels);
    font_cfg.EllipsisChar = (ImWchar)0x0085;
    font_cfg.GlyphOffset.y = 1.0f * IM_FLOOR(font_cfg.SizePixels / 13.0f);  // Add +1 offset per 13 units

    const ImWchar* glyph_ranges = font_cfg.GlyphRanges != NULL ? font_cfg.GlyphRanges : GetGlyphRangesDefault();
    ImFont* font = AddFontFromMemoryCompressedTTF((void*)roboto_medium_compressed_data,
            roboto_medium_compressed_size, font_cfg.SizePixels, &font_cfg, glyph_ranges);
    return font;
}